

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O2

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig
          (cmScriptGenerator *this,ostream *os,Indent *indent)

{
  char *pcVar1;
  bool bVar2;
  Indent *this_00;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  ostream *poVar6;
  pointer pbVar7;
  char *pcVar8;
  string config_test;
  allocator local_85;
  int local_84;
  ostream *local_80;
  Indent *local_78;
  string local_70;
  string local_50;
  
  pbVar7 = (this->ConfigurationTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->ConfigurationTypes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar7 != pbVar5) {
    bVar2 = true;
    local_80 = os;
    local_78 = indent;
    for (; pbVar7 != pbVar5; pbVar7 = pbVar7 + 1) {
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::string((string *)&local_70,pcVar1,(allocator *)&local_50);
      bVar3 = GeneratesForConfig(this,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      if (bVar3) {
        std::__cxx11::string::string((string *)&local_50,pcVar1,(allocator *)&local_84);
        CreateConfigTest(&local_70,this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        cmScriptGeneratorIndent::Write(local_78,local_80);
        pcVar8 = "elseif(";
        if (bVar2) {
          pcVar8 = "if(";
        }
        poVar6 = std::operator<<(local_80,pcVar8);
        poVar6 = std::operator<<(poVar6,(string *)&local_70);
        std::operator<<(poVar6,")\n");
        std::__cxx11::string::string((string *)&local_50,pcVar1,&local_85);
        local_84 = local_78->Level + 2;
        (*this->_vptr_cmScriptGenerator[5])(this,local_80,&local_50,&local_84);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        bVar2 = false;
      }
      pbVar5 = (this->ConfigurationTypes->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (!bVar2) {
      iVar4 = (*this->_vptr_cmScriptGenerator[7])(this);
      this_00 = local_78;
      poVar6 = local_80;
      if ((char)iVar4 != '\0') {
        cmScriptGeneratorIndent::Write(local_78,local_80);
        std::operator<<(poVar6,"else()\n");
        local_70._M_dataplus._M_p._0_4_ = this_00->Level + 2;
        (*this->_vptr_cmScriptGenerator[6])(this,poVar6);
      }
      cmScriptGeneratorIndent::Write(this_00,poVar6);
      std::operator<<(poVar6,"endif()\n");
    }
    return;
  }
  GenerateScriptActionsOnce(this,os,indent);
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent const& indent)
{
  if(this->ConfigurationTypes->empty())
    {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
    }
  else
    {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for(std::vector<std::string>::const_iterator i =
          this->ConfigurationTypes->begin();
        i != this->ConfigurationTypes->end(); ++i)
      {
      const char* config = i->c_str();
      if(this->GeneratesForConfig(config))
        {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(config);
        os << indent << (first? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, config, indent.Next());
        first = false;
        }
      }
    if(!first)
      {
      if(this->NeedsScriptNoConfig())
        {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
        }
      os << indent << "endif()\n";
      }
    }
}